

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O1

bool __thiscall
Js::PathTypeHandlerWithAttr::IsObjTypeSpecEquivalent
          (PathTypeHandlerWithAttr *this,Type *type,TypeEquivalenceRecord *record,
          uint *failedPropertyIndex)

{
  ObjectSlotAttributes *attributes;
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  EquivalentPropertyEntry *entry;
  bool bVar4;
  
  uVar2 = (ulong)record->propertyCount;
  bVar4 = uVar2 == 0;
  if (!bVar4) {
    attributes = (this->attributes).ptr;
    entry = record->properties;
    bVar1 = PathTypeHandlerBase::IsObjTypeSpecEquivalentHelper
                      ((PathTypeHandlerBase *)this,type,attributes,entry);
    uVar3 = 0;
    bVar4 = false;
    if (bVar1) {
      uVar3 = 0;
      do {
        entry = entry + 1;
        if (uVar2 - 1 == uVar3) {
          return true;
        }
        bVar4 = PathTypeHandlerBase::IsObjTypeSpecEquivalentHelper
                          ((PathTypeHandlerBase *)this,type,attributes,entry);
        uVar3 = uVar3 + 1;
      } while (bVar4);
      bVar4 = uVar2 <= uVar3;
    }
    *failedPropertyIndex = (uint)uVar3;
  }
  return bVar4;
}

Assistant:

bool PathTypeHandlerWithAttr::IsObjTypeSpecEquivalent(const Type* type, const TypeEquivalenceRecord& record, uint& failedPropertyIndex)
    {
        return IsObjTypeSpecEquivalentHelper(type, attributes, record, failedPropertyIndex);
    }